

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

float notch::core::internal::dot<float*,float*>
                (size_t n,float *x_begin,size_t x_stride,float *y_begin,size_t y_stride)

{
  float fVar1;
  float *y;
  float *x;
  bool bVar2;
  
  fVar1 = 0.0;
  while (bVar2 = n != 0, n = n - 1, bVar2) {
    fVar1 = fVar1 + *x_begin * *y_begin;
    x_begin = x_begin + x_stride;
    y_begin = y_begin + y_stride;
  }
  return fVar1;
}

Assistant:

float
INTERNAL_NOBLAS(dot)(
    const size_t n,
    VectorX_Iter x_begin, const size_t x_stride,
    VectorY_Iter y_begin, const size_t y_stride) {
    double dotProduct = 0.0;
    auto x = x_begin;
    auto y = y_begin;
    for (size_t i = 0; i < n; ++i) {
        dotProduct += (*x) * (*y);
        x += x_stride;
        y += y_stride;
    }
    return static_cast<float>(dotProduct);
}